

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O3

void skewness_double_suite::test_left_skew(void)

{
  double dVar1;
  anon_struct_8_1_6167ffdf_for_sum aVar2;
  double dVar3;
  close_to<double> predicate;
  close_to<double> predicate_00;
  close_to<double> predicate_01;
  close_to<double> predicate_02;
  close_to<double> predicate_03;
  close_to<double> predicate_04;
  close_to<double> predicate_05;
  close_to<double> predicate_06;
  close_to<double> predicate_07;
  double *in_stack_ffffffffffffff58;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  undefined8 uStack_80;
  moment_skewness<double> filter;
  
  filter.super_basic_moment<double,_(trial::online::with)2>.
  super_basic_moment<double,_(trial::online::with)1>.mean_factor = 0.125;
  filter.super_basic_moment<double,_(trial::online::with)2>.
  super_basic_moment<double,_(trial::online::with)1>.normalization = 0.0;
  filter.super_basic_moment<double,_(trial::online::with)2>.
  super_basic_moment<double,_(trial::online::with)1>.sum.mean = 0.0;
  filter.super_basic_moment<double,_(trial::online::with)2>.var_factor = 0.25;
  filter.super_basic_moment<double,_(trial::online::with)2>.normalization = 0.0;
  filter.super_basic_moment<double,_(trial::online::with)2>.sum.variance = 0.0;
  filter.skewness_factor = 0.25;
  filter.normalization = 0.0;
  filter.sum.skewness = 0.0;
  trial::online::decay::basic_moment<double,_(trial::online::with)3>::push(&filter,1.0);
  local_98 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                     super_basic_moment<double,_(trial::online::with)1>.
                                     normalization) &
                     (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.
                             super_basic_moment<double,_(trial::online::with)1>.sum.mean /
                            filter.super_basic_moment<double,_(trial::online::with)2>.
                            super_basic_moment<double,_(trial::online::with)1>.normalization));
  local_a0 = 1.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","1.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x266,"void skewness_double_suite::test_left_skew()",&local_98,&local_a0);
  local_98 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                     normalization) &
                     (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.sum.variance
                            / filter.super_basic_moment<double,_(trial::online::with)2>.
                              normalization));
  local_a0 = 0.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.variance()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x267,"void skewness_double_suite::test_left_skew()",&local_98,&local_a0);
  dVar1 = 0.0;
  if (0.0 < filter.normalization) {
    dVar3 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                    normalization) &
                    (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.sum.variance /
                           filter.super_basic_moment<double,_(trial::online::with)2>.normalization))
    ;
    if (2.220446049250313e-16 < dVar3) {
      if (dVar3 < 0.0) {
        local_90 = filter.sum.skewness;
        uStack_80 = 0;
        local_88 = dVar3;
        dVar1 = sqrt(dVar3);
        aVar2.skewness = local_90;
        dVar3 = local_88;
      }
      else {
        dVar1 = SQRT(dVar3);
        aVar2 = filter.sum;
      }
      dVar1 = (aVar2.skewness / (dVar3 * dVar1)) / filter.normalization;
    }
  }
  local_a0 = 0.0;
  local_98 = dVar1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.skewness()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x268,"void skewness_double_suite::test_left_skew()",&local_98,&local_a0);
  trial::online::decay::basic_moment<double,_(trial::online::with)3>::push(&filter,2.0);
  local_98 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                     super_basic_moment<double,_(trial::online::with)1>.
                                     normalization) &
                     (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.
                             super_basic_moment<double,_(trial::online::with)1>.sum.mean /
                            filter.super_basic_moment<double,_(trial::online::with)2>.
                            super_basic_moment<double,_(trial::online::with)1>.normalization));
  local_a0 = 1.53333;
  predicate.absolute = 2.2250738585072014e-308;
  predicate.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.53333","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x26a,0x10e8c5,(char *)&local_98,&local_a0,in_stack_ffffffffffffff58,predicate
            );
  local_98 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                     normalization) &
                     (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.sum.variance
                            / filter.super_basic_moment<double,_(trial::online::with)2>.
                              normalization));
  local_a0 = 0.124444;
  predicate_00.absolute = 2.2250738585072014e-308;
  predicate_00.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","0.124444","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x26b,0x10e8c5,(char *)&local_98,&local_a0,in_stack_ffffffffffffff58,
             predicate_00);
  dVar1 = 0.0;
  if ((0.0 < filter.normalization) &&
     (dVar3 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                      normalization) &
                      (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.sum.variance
                             / filter.super_basic_moment<double,_(trial::online::with)2>.
                               normalization)), 2.220446049250313e-16 < dVar3)) {
    if (dVar3 < 0.0) {
      local_90 = filter.sum.skewness;
      uStack_80 = 0;
      local_88 = dVar3;
      dVar1 = sqrt(dVar3);
      aVar2.skewness = local_90;
      dVar3 = local_88;
    }
    else {
      dVar1 = SQRT(dVar3);
      aVar2 = filter.sum;
    }
    dVar1 = (aVar2.skewness / (dVar3 * dVar1)) / filter.normalization;
  }
  local_a0 = 1.32288;
  predicate_01.absolute = 2.2250738585072014e-308;
  predicate_01.relative = 1e-05;
  local_98 = dVar1;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","1.32288","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x26c,0x10e8c5,(char *)&local_98,&local_a0,in_stack_ffffffffffffff58,
             predicate_01);
  trial::online::decay::basic_moment<double,_(trial::online::with)3>::push(&filter,5.0);
  local_98 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                     super_basic_moment<double,_(trial::online::with)1>.
                                     normalization) &
                     (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.
                             super_basic_moment<double,_(trial::online::with)1>.sum.mean /
                            filter.super_basic_moment<double,_(trial::online::with)2>.
                            super_basic_moment<double,_(trial::online::with)1>.normalization));
  local_a0 = 2.84615;
  predicate_02.absolute = 2.2250738585072014e-308;
  predicate_02.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","2.84615","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x26e,0x10e8c5,(char *)&local_98,&local_a0,in_stack_ffffffffffffff58,
             predicate_02);
  local_98 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                     normalization) &
                     (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.sum.variance
                            / filter.super_basic_moment<double,_(trial::online::with)2>.
                              normalization));
  local_a0 = 2.07671;
  predicate_03.absolute = 2.2250738585072014e-308;
  predicate_03.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","2.07671","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x26f,0x10e8c5,(char *)&local_98,&local_a0,in_stack_ffffffffffffff58,
             predicate_03);
  dVar1 = 0.0;
  if ((0.0 < filter.normalization) &&
     (dVar3 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                      normalization) &
                      (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.sum.variance
                             / filter.super_basic_moment<double,_(trial::online::with)2>.
                               normalization)), 2.220446049250313e-16 < dVar3)) {
    if (dVar3 < 0.0) {
      local_90 = filter.sum.skewness;
      uStack_80 = 0;
      local_88 = dVar3;
      dVar1 = sqrt(dVar3);
      aVar2.skewness = local_90;
      dVar3 = local_88;
    }
    else {
      dVar1 = SQRT(dVar3);
      aVar2 = filter.sum;
    }
    dVar1 = (aVar2.skewness / (dVar3 * dVar1)) / filter.normalization;
  }
  local_a0 = 1.45479;
  predicate_04.absolute = 2.2250738585072014e-308;
  predicate_04.relative = 1e-05;
  local_98 = dVar1;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","1.45479","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x270,0x10e8c5,(char *)&local_98,&local_a0,in_stack_ffffffffffffff58,
             predicate_04);
  trial::online::decay::basic_moment<double,_(trial::online::with)3>::push(&filter,15.0);
  local_98 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                     super_basic_moment<double,_(trial::online::with)1>.
                                     normalization) &
                     (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.
                             super_basic_moment<double,_(trial::online::with)1>.sum.mean /
                            filter.super_basic_moment<double,_(trial::online::with)2>.
                            super_basic_moment<double,_(trial::online::with)1>.normalization));
  local_a0 = 6.5174;
  predicate_05.absolute = 2.2250738585072014e-308;
  predicate_05.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","6.5174","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x272,0x10e8c5,(char *)&local_98,&local_a0,in_stack_ffffffffffffff58,
             predicate_05);
  local_98 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                     normalization) &
                     (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.sum.variance
                            / filter.super_basic_moment<double,_(trial::online::with)2>.
                              normalization));
  local_a0 = 27.632;
  predicate_06.absolute = 2.2250738585072014e-308;
  predicate_06.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","27.632","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x273,0x10e8c5,(char *)&local_98,&local_a0,in_stack_ffffffffffffff58,
             predicate_06);
  dVar1 = 0.0;
  if ((0.0 < filter.normalization) &&
     (dVar3 = (double)(-(ulong)(0.0 < filter.super_basic_moment<double,_(trial::online::with)2>.
                                      normalization) &
                      (ulong)(filter.super_basic_moment<double,_(trial::online::with)2>.sum.variance
                             / filter.super_basic_moment<double,_(trial::online::with)2>.
                               normalization)), 2.220446049250313e-16 < dVar3)) {
    if (dVar3 < 0.0) {
      local_90 = filter.sum.skewness;
      uStack_80 = 0;
      local_88 = dVar3;
      dVar1 = sqrt(dVar3);
      aVar2.skewness = local_90;
      dVar3 = local_88;
    }
    else {
      dVar1 = SQRT(dVar3);
      aVar2 = filter.sum;
    }
    dVar1 = (aVar2.skewness / (dVar3 * dVar1)) / filter.normalization;
  }
  local_a0 = 1.55579;
  predicate_07.absolute = 2.2250738585072014e-308;
  predicate_07.relative = 1e-05;
  local_98 = dVar1;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","1.55579","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x274,0x10e8c5,(char *)&local_98,&local_a0,in_stack_ffffffffffffff58,
             predicate_07);
  return;
}

Assistant:

void test_left_skew()
{
    const auto tolerance = detail::close_to<double>(1e-5);
    decay::moment_skewness<double> filter(one_over_eight, one_over_four, one_over_four);

    filter.push(1.0);
    TRIAL_TEST_EQ(filter.mean(), 1.0);
    TRIAL_TEST_EQ(filter.variance(), 0.0);
    TRIAL_TEST_EQ(filter.skewness(), 0.0);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.mean(), 1.53333, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 0.124444, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 1.32288, tolerance);
    filter.push(5.0);
    TRIAL_TEST_WITH(filter.mean(), 2.84615, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 2.07671, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 1.45479, tolerance);
    filter.push(15.0);
    TRIAL_TEST_WITH(filter.mean(), 6.5174, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 27.632, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 1.55579, tolerance);
}